

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

int __thiscall pstore::file::deleter_base::unlink(deleter_base *this,char *__name)

{
  int in_EAX;
  int extraout_EAX;
  
  if (this->released_ == false) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->unlinker_,&this->path_);
    this->released_ = true;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void deleter_base::unlink () {
            if (!released_) {
                unlinker_ (path_);
                released_ = true;
            }
        }